

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

bool vkt::pipeline::isVertexFormatUfloat(VkFormat format)

{
  return (format & ~VK_FORMAT_R4G4_UNORM_PACK8) == VK_FORMAT_B10G11R11_UFLOAT_PACK32;
}

Assistant:

bool isVertexFormatUfloat (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
		case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
			return true;

		default:
			break;
	}

	return false;

}